

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_test_util.cc
# Opt level: O2

Template * ctemplate::StringToTemplate(string *s,Strip strip)

{
  Template *pTVar1;
  string local_50;
  TemplateString local_30;
  
  StringToTemplateFile(&local_50,s);
  local_30.ptr_ = local_50._M_dataplus._M_p;
  local_30.length_ = local_50._M_string_length;
  local_30.is_immutable_ = false;
  local_30.id_ = 0;
  pTVar1 = (Template *)ctemplate::Template::GetTemplate(&local_30,strip);
  std::__cxx11::string::~string((string *)&local_50);
  return pTVar1;
}

Assistant:

Template* StringToTemplate(const string& s, Strip strip) {
  return Template::GetTemplate(StringToTemplateFile(s), strip);
}